

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastErS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 uVar1;
  char *pcVar2;
  ushort *puVar3;
  ulong uVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar1 = *(undefined8 *)
           ((long)&table->has_bits_offset +
           ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  uVar7 = (ulong)ptr[1];
  if ((long)uVar7 < 0) {
    uVar4 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar4 < 0) {
      uVar8 = (long)ptr[3] << 0xe | 0x3fff;
      if ((long)uVar8 < 0) {
        uVar4 = uVar4 & ((long)ptr[4] << 0x15 | 0x1fffffU);
        if ((long)uVar4 < 0) {
          uVar8 = uVar8 & ((long)ptr[5] << 0x1c | 0xfffffffU);
          if ((long)uVar8 < 0) {
            uVar4 = uVar4 & ((long)ptr[6] << 0x23 | 0x7ffffffffU);
            if ((long)uVar4 < 0) {
              uVar8 = uVar8 & ((long)ptr[7] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar8 < 0) {
                uVar4 = uVar4 & ((long)ptr[8] << 0x31 | 0x1ffffffffffffU);
                if ((long)uVar4 < 0) {
                  uVar8 = uVar8 & ((ulong)(byte)ptr[9] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar8 < 0) {
                    puVar3 = (ushort *)(ptr + 0xb);
                    if ((ptr[10] != '\x01') && (ptr[10] < '\0')) {
                      puVar3 = (ushort *)0x0;
                      goto LAB_00281df7;
                    }
                  }
                  else {
                    puVar3 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar3 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar3 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar3 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar3 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar3 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar3 = (ushort *)(ptr + 4);
      }
      uVar4 = uVar4 & uVar8;
    }
    else {
      puVar3 = (ushort *)(ptr + 3);
    }
    uVar7 = uVar7 & uVar4;
  }
  else {
    puVar3 = (ushort *)(ptr + 2);
  }
LAB_00281df7:
  if (puVar3 == (ushort *)0x0) {
    pcVar2 = Error(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar5 = (uint)uVar7;
  if (((int)uVar5 < (int)uVar1) || ((int)((ulong)uVar1 >> 0x20) < (int)uVar5)) {
    pcVar2 = FastUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  puVar6 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar6 & 3) == 0) {
    *puVar6 = uVar5;
    if (puVar3 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar5 = (uint)table->fast_idx_mask & (uint)*puVar3;
      if ((uVar5 & 7) == 0) {
        uVar7 = (ulong)(uVar5 & 0xfffffff8);
        pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                   (msg,puVar3,ctx,
                                    (ulong)*puVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2)
                                   );
        return pcVar2;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar6 & 3) != 0) goto LAB_00281f0a;
      *puVar6 = *puVar6 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
    }
    return (char *)puVar3;
  }
LAB_00281f0a:
  AlignFail(puVar6);
}

Assistant:

PROTOBUF_ALWAYS_INLINE const char* TcParser::SingularEnum(
    PROTOBUF_TC_PARAM_DECL) {
  if (ABSL_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  const TcParseTableBase::FieldAux aux = *table->field_aux(data.aux_idx());
  PrefetchEnumData(xform_val, aux);
  const char* ptr2 = ptr;  // Save for unknown enum case
  ptr += sizeof(TagType);  // Consume tag
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  if (ABSL_PREDICT_FALSE(
          !EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux))) {
    ptr = ptr2;
    PROTOBUF_MUSTTAIL return FastUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
  }
  hasbits |= (uint64_t{1} << data.hasbit_idx());
  RefAt<int32_t>(msg, data.offset()) = tmp;
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}